

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool re2::re2_internal::Parse<unsigned_int>(char *str,size_t n,uint *dest,int radix)

{
  bool bVar1;
  unsigned_long r;
  ulong local_10;
  
  bVar1 = Parse<unsigned_long>(str,n,&local_10,radix);
  if ((bVar1) && (local_10 >> 0x20 == 0)) {
    bVar1 = true;
    if (dest != (uint *)0x0) {
      *dest = (uint)local_10;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parse(const char* str, size_t n, unsigned int* dest, int radix) {
  unsigned long r;
  if (!Parse(str, n, &r, radix)) return false;  // Could not parse
  if ((unsigned int)r != r) return false;       // Out of range
  if (dest == NULL) return true;
  *dest = (unsigned int)r;
  return true;
}